

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::generate_serialize_set_element
          (t_lua_generator *this,ostream *out,t_set *tset,string *iter)

{
  t_type *type;
  pointer pcVar1;
  t_field efield;
  string local_118;
  string local_f8;
  t_field local_d8;
  
  type = tset->elem_type_;
  pcVar1 = (iter->_M_dataplus)._M_p;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar1,pcVar1 + iter->_M_string_length);
  t_field::t_field(&local_d8,type,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  generate_serialize_field(this,out,&local_d8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  t_field::~t_field(&local_d8);
  return;
}

Assistant:

void t_lua_generator::generate_serialize_set_element(ostream& out, t_set* tset, string iter) {
  t_field efield(tset->get_elem_type(), iter);
  generate_serialize_field(out, &efield, "");
}